

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<TPZFlopCounter>::Decompose_Cholesky
          (TPZMatrix<TPZFlopCounter> *this,list<long,_std::allocator<long>_> *singular)

{
  long lVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  int64_t k;
  long lVar4;
  long lVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double __x;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  long local_68;
  double local_60;
  TPZFlopCounter tmp;
  double local_48;
  long local_40;
  list<long,_std::allocator<long>_> *local_38;
  
  cVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  local_38 = singular;
  if ((cVar2 != '\0') && (cVar2 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar2 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_40 = CONCAT44(extraout_var,iVar3);
    for (local_68 = 0; local_68 < local_40; local_68 = local_68 + 1) {
      for (lVar4 = 0; lVar5 = local_68, lVar4 < local_68; lVar4 = lVar4 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (this,local_68,local_68);
        local_60 = extraout_XMM0_Qa;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_68,lVar4);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_68,lVar4);
        tmp.fVal = local_60 - extraout_XMM0_Qa_01 * extraout_XMM0_Qa_00;
        TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
        TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar5,lVar5,&tmp);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_68,local_68)
      ;
      if (ABS(extraout_XMM0_Qa_02) <= 1e-12) {
        std::__cxx11::list<long,_std::allocator<long>_>::push_back(local_38,&local_68);
        tmp.fVal = 1.0;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,local_68,local_68,&tmp);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_68);
      if (__x < 0.0) {
        tmp.fVal = sqrt(__x);
      }
      else {
        tmp.fVal = SQRT(__x);
      }
      TPZFlopCounter::gCount.fCount[3] = TPZFlopCounter::gCount.fCount[3] + 1;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,local_68,local_68,&tmp);
      lVar4 = local_68;
      while (lVar4 = lVar4 + 1, lVar4 < local_40) {
        for (lVar5 = 0; lVar1 = local_68, lVar5 < local_68; lVar5 = lVar5 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (this,local_68,lVar4);
          local_60 = extraout_XMM0_Qa_03;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (this,local_68,lVar5);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar4);
          local_48 = local_60 - extraout_XMM0_Qa_05 * extraout_XMM0_Qa_04;
          TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
          TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar1,lVar4,&local_48);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (this,local_68,local_68);
        if (ABS(extraout_XMM0_Qa_06) < 1e-12) {
          Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
        }
        lVar5 = local_68;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_68,lVar4);
        local_60 = extraout_XMM0_Qa_07;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_68);
        TPZFlopCounter::gCount.fCount[2] = TPZFlopCounter::gCount.fCount[2] + 1;
        local_48 = local_60 / extraout_XMM0_Qa_08;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar5,lVar4,&local_48);
        lVar5 = local_68;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_68,lVar4);
        local_48 = extraout_XMM0_Qa_09;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar4,lVar5,&local_48);
      }
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular) {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {             //elementos da diagonal
			PutVal( i,i,GetVal(i,i)-GetVal(i,k)*GetVal(i,k) );
		}
		if((fabs(GetVal(i,i))) <= fabs((TVar)1.e-12))
		{
			singular.push_back(i);
			PutVal(i,i,1.);
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {           //elementos fora da diagonal
            for(int64_t k=0; k<i; k++) {
                PutVal( i,j,GetVal(i,j)-GetVal(i,k)*GetVal(k,j) );
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            PutVal(j,i,GetVal(i,j));
			
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
}